

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpness_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_d4aa1f::SharpnessTest::DoTest(SharpnessTest *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  EncoderTest *pEVar3;
  pointer pVVar4;
  Message *pMVar5;
  Message *pMVar6;
  SharpnessTest *in_RDI;
  AssertionResult gtest_ar_1;
  double psnr;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertionResult gtest_ar;
  unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> video;
  pointer in_stack_fffffffffffffe98;
  SharpnessTest *in_stack_fffffffffffffea0;
  unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_>
  *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int iVar7;
  char *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  Type TVar8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  AssertionResult local_b8;
  double local_a8;
  HasNewFatalFailureHelper local_90;
  uint local_74;
  undefined8 local_60;
  AssertionResult local_58;
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  (in_RDI->super_EncoderTest).init_flags_ = 0x10000;
  this_00 = (AssertHelper *)operator_new(0xd8);
  local_45 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"paris_352_288_30.y4m",&local_31);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(uint)((ulong)in_stack_fffffffffffffec0 >> 0x20),
             (int)in_stack_fffffffffffffec0);
  TVar8 = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_45 = 0;
  std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>::
  unique_ptr<std::default_delete<libaom_test::VideoSource>,void>
            ((unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_60 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (void **)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::AssertionResult::failure_message((AssertionResult *)0x902a1c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),TVar8,
               in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)in_RDI);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x902a79);
  }
  local_74 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x902ae7);
  if (local_74 != 0) goto LAB_00902f01;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pEVar3 = &in_RDI->super_EncoderTest;
      pVVar4 = std::
               unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_>
               ::get((unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_>
                      *)in_stack_fffffffffffffea0);
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(pEVar3,pVVar4);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_90);
    if (bVar1) {
      local_74 = 2;
    }
    else {
      local_74 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffea0);
    if (local_74 == 0) {
      local_a8 = GetAveragePsnr(in_RDI);
      GetPsnrThreshold(in_stack_fffffffffffffea0);
      testing::internal::CmpHelperGT<double,double>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (double *)in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!(bool)uVar2) {
        testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
        pMVar5 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffea0,
                            (char (*) [17])in_stack_fffffffffffffe98);
        TVar8 = (Type)((ulong)pMVar5 >> 0x20);
        pMVar5 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffea0,
                            (TestMode *)in_stack_fffffffffffffe98);
        pMVar6 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffea0,
                            (char (*) [14])in_stack_fffffffffffffe98);
        iVar7 = (int)((ulong)pMVar6 >> 0x20);
        pMVar6 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffea0,(char (*) [21])in_stack_fffffffffffffe98);
        in_stack_fffffffffffffea0 =
             (SharpnessTest *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98);
        testing::AssertionResult::failure_message((AssertionResult *)0x902e49);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffed0),TVar8,(char *)pMVar5,
                   iVar7,(char *)pMVar6);
        testing::internal::AssertHelper::operator=(this_00,(Message *)in_RDI);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
        testing::Message::~Message((Message *)0x902ea1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x902ef6);
      local_74 = 0;
      goto LAB_00902f01;
    }
    if (local_74 != 2) goto LAB_00902f01;
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),TVar8,
             in_stack_fffffffffffffec0,iVar7,in_stack_fffffffffffffeb0);
  testing::internal::AssertHelper::operator=(this_00,(Message *)in_RDI);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
  testing::Message::~Message((Message *)0x902c79);
  local_74 = 1;
LAB_00902f01:
  std::unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_>::
  ~unique_ptr((unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_>
               *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

void DoTest() {
    init_flags_ = AOM_CODEC_USE_PSNR;

    std::unique_ptr<libaom_test::VideoSource> video(
        new libaom_test::Y4mVideoSource("paris_352_288_30.y4m", 0, kFrames));
    ASSERT_NE(video, nullptr);

    ASSERT_NO_FATAL_FAILURE(RunLoop(video.get()));
    const double psnr = GetAveragePsnr();
    EXPECT_GT(psnr, GetPsnrThreshold())
        << "encoding mode = " << encoding_mode_ << ", cpu used = " << cpu_used_
        << ", sharpness level = " << sharpness_level_;
  }